

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O3

void duckdb::IntervalTryAddition<long>
               (long *target,int64_t input,int64_t multiplier,int64_t fraction)

{
  duckdb *this;
  bool bVar1;
  OutOfRangeException *pOVar2;
  undefined1 auVar3 [16];
  long result;
  int64_t addition;
  string local_58;
  int64_t local_38;
  duckdb *local_30;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(input,multiplier,(int64_t *)&local_30);
  if (!bVar1) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"interval value is out of range","");
    OutOfRangeException::OutOfRangeException(pOVar2,&local_58);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryCast::Operation<long,long>((int64_t)local_30,&local_38,false);
  if (!bVar1) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,long>((string *)&local_58,local_30,auVar3._8_8_);
    InvalidInputException::InvalidInputException(auVar3._0_8_,&local_58);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryAddOperator::Operation<long,long,long>(*target,local_38,target);
  if (!bVar1) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"interval value is out of range","");
    OutOfRangeException::OutOfRangeException(pOVar2,&local_58);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (fraction != 0) {
    this = (duckdb *)((fraction * multiplier) / 1000000);
    local_30 = this;
    bVar1 = TryCast::Operation<long,long>((int64_t)this,&local_38,false);
    if (!bVar1) {
      auVar3 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,long>((string *)&local_58,this,auVar3._8_8_);
      InvalidInputException::InvalidInputException(auVar3._0_8_,&local_58);
      __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    bVar1 = TryAddOperator::Operation<long,long,long>(*target,local_38,target);
    if (!bVar1) {
      pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"interval fraction is out of range","");
      OutOfRangeException::OutOfRangeException(pOVar2,&local_58);
      __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void IntervalTryAddition(T &target, int64_t input, int64_t multiplier, int64_t fraction = 0) {
	int64_t addition;
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(input, multiplier, addition)) {
		throw OutOfRangeException("interval value is out of range");
	}
	T addition_base = Cast::Operation<int64_t, T>(addition);
	if (!TryAddOperator::Operation<T, T, T>(target, addition_base, target)) {
		throw OutOfRangeException("interval value is out of range");
	}
	if (fraction) {
		//	Add in (fraction * multiplier) / MICROS_PER_SEC
		//	This is always in range
		addition = (fraction * multiplier) / Interval::MICROS_PER_SEC;
		addition_base = Cast::Operation<int64_t, T>(addition);
		if (!TryAddOperator::Operation<T, T, T>(target, addition_base, target)) {
			throw OutOfRangeException("interval fraction is out of range");
		}
	}
}